

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O0

double __thiscall chrono::viper::Viper::GetWheelTracTorque(Viper *this,ViperWheelID id)

{
  int iVar1;
  element_type *peVar2;
  __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar3;
  ViperWheelID id_local;
  Viper *this_local;
  
  peVar2 = std::
           __shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_driver);
  iVar1 = (*peVar2->_vptr_ViperDriver[2])();
  if (iVar1 == 1) {
    this_local = (Viper *)0x0;
  }
  else {
    this_00 = (__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_4UL>::operator[]
                           (&this->m_drive_motors,(ulong)id);
    peVar3 = std::
             __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    this_local = (Viper *)(**(code **)(*(long *)peVar3 + 0x280))();
  }
  return (double)this_local;
}

Assistant:

double Viper::GetWheelTracTorque(ViperWheelID id) const {
    if (m_driver->GetDriveMotorType() == ViperDriver::DriveMotorType::TORQUE)
        return 0;

    return m_drive_motors[id]->GetMotorTorque();
}